

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O1

void test_contains_all(void)

{
  uint64_t *puVar1;
  long lVar2;
  bool bVar3;
  _Bool _Var4;
  bitset_t *pbVar5;
  bitset_t *bitset;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint64_t uVar10;
  size_t shiftedi;
  ulong uVar11;
  ulong uVar12;
  int i;
  ulong uVar13;
  ulong auStack_60 [4];
  bitset_t *pbStack_40;
  bitset_t *pbStack_38;
  code *pcStack_30;
  
  pcStack_30 = (code *)0x10246a;
  pbVar5 = bitset_create();
  uVar13 = 0;
  pcStack_30 = (code *)0x102475;
  bitset = bitset_create();
  do {
    uVar11 = uVar13 >> 6;
    if (uVar11 < pbVar5->arraysize) {
LAB_00102496:
      pbVar5->array[uVar11] = pbVar5->array[uVar11] | 1L << ((byte)uVar13 & 0x3f);
    }
    else {
      pcStack_30 = (code *)0x102492;
      _Var4 = bitset_grow(pbVar5,uVar11 + 1);
      if (_Var4) goto LAB_00102496;
    }
    if ((uVar13 & 1) == 0) {
      if (bitset->arraysize <= uVar11) {
        pcStack_30 = (code *)0x1024c1;
        _Var4 = bitset_grow(bitset,uVar11 + 1);
        if (!_Var4) goto LAB_001024da;
      }
      bitset->array[uVar11] = bitset->array[uVar11] | 1L << ((byte)uVar13 & 0x3e);
    }
LAB_001024da:
    uVar13 = uVar13 + 1;
  } while (uVar13 != 1000);
  pcStack_30 = (code *)0x1024f1;
  _Var4 = bitset_contains_all(pbVar5,bitset);
  if (_Var4) {
    pcStack_30 = (code *)0x102500;
    _Var4 = bitset_contains_all(bitset,pbVar5);
    if (_Var4) goto LAB_0010256b;
    if (bitset->arraysize < 0x10) {
      pcStack_30 = (code *)0x102518;
      _Var4 = bitset_grow(bitset,0x10);
      if (_Var4) goto LAB_0010251c;
    }
    else {
LAB_0010251c:
      bitset->array[0xf] = bitset->array[0xf] | 0x20000000000;
    }
    pcStack_30 = (code *)0x102538;
    _Var4 = bitset_contains_all(pbVar5,bitset);
    if (!_Var4) {
      pcStack_30 = (code *)0x102547;
      _Var4 = bitset_contains_all(bitset,pbVar5);
      if (!_Var4) {
        pcStack_30 = (code *)0x102553;
        bitset_free(pbVar5);
        bitset_free(bitset);
        return;
      }
      goto LAB_00102575;
    }
  }
  else {
    pcStack_30 = (code *)0x10256b;
    test_contains_all_cold_1();
LAB_0010256b:
    pcStack_30 = (code *)0x102570;
    test_contains_all_cold_4();
  }
  pcStack_30 = (code *)0x102575;
  test_contains_all_cold_3();
LAB_00102575:
  pcStack_30 = test_next_bits_iterate;
  test_contains_all_cold_2();
  uVar11 = 0;
  pbStack_40 = pbVar5;
  pbStack_38 = bitset;
  pcStack_30 = (code *)uVar13;
  pbVar5 = bitset_create();
  do {
    uVar13 = uVar11 >> 6;
    if (uVar13 < pbVar5->arraysize) {
LAB_001025ab:
      pbVar5->array[uVar13] = pbVar5->array[uVar13] | 1L << ((byte)uVar11 & 0x3f);
    }
    else {
      _Var4 = bitset_grow(pbVar5,uVar13 + 1);
      if (_Var4) goto LAB_001025ab;
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 100);
  uVar13 = 0x3e6;
  do {
    uVar13 = uVar13 + 2;
    uVar11 = uVar13 >> 6;
    if (uVar11 < pbVar5->arraysize) {
LAB_001025ed:
      pbVar5->array[uVar11] = pbVar5->array[uVar11] | 1L << ((byte)uVar13 & 0x3e);
    }
    else {
      _Var4 = bitset_grow(pbVar5,uVar11 + 1);
      if (_Var4) goto LAB_001025ed;
    }
  } while (uVar13 < 0x44a);
  uVar13 = pbVar5->arraysize;
  uVar11 = 0;
  lVar8 = 0;
LAB_0010261a:
  uVar7 = uVar11 >> 6;
  if (uVar7 < uVar13) {
    puVar1 = pbVar5->array;
    uVar10 = (puVar1[uVar7] >> ((byte)uVar11 & 0x3f)) << ((byte)uVar11 & 0x3f);
    uVar9 = uVar11 & 0xffffffffffffffc0;
    uVar6 = 0;
    do {
      while (uVar10 == 0) {
        uVar7 = uVar7 + 1;
        if (uVar7 == uVar13) goto LAB_0010268b;
        uVar9 = uVar9 + 0x40;
        uVar10 = puVar1[uVar7];
        if (2 < uVar6) goto LAB_0010268b;
      }
      uVar12 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
        }
      }
      auStack_60[uVar6] = uVar12 | uVar9;
      uVar12 = uVar10 - 1;
      if (uVar6 == 2) {
        uVar12 = 0xffffffffffffffff;
      }
      uVar6 = uVar6 + 1;
      uVar10 = uVar10 & uVar12;
    } while (uVar6 != 3);
    uVar6 = 3;
LAB_0010268b:
    if (uVar6 != 0) {
      uVar11 = auStack_60[uVar6 - 1];
    }
  }
  else {
    uVar6 = 0;
  }
  if (uVar6 != 0) {
    uVar7 = lVar8 * 2 + 800;
    uVar9 = 0;
    do {
      uVar12 = lVar8 + uVar9;
      if (99 < lVar8 + uVar9) {
        uVar12 = uVar7;
      }
      if (auStack_60[uVar9] != uVar12) {
        test_next_bits_iterate_cold_1();
        goto LAB_001026f4;
      }
      uVar9 = uVar9 + 1;
      uVar7 = uVar7 + 2;
    } while (uVar6 != uVar9);
    uVar11 = uVar11 + 1;
    lVar8 = uVar6 + lVar8;
    goto LAB_0010261a;
  }
  if (lVar8 == 0x96) {
    bitset_free(pbVar5);
    return;
  }
LAB_001026f4:
  test_next_bits_iterate_cold_2();
  uVar13 = 0;
  pbVar5 = bitset_create();
  do {
    uVar11 = uVar13 >> 6;
    if ((uVar11 < pbVar5->arraysize) || (_Var4 = bitset_grow(pbVar5,uVar11 + 1), _Var4)) {
      pbVar5->array[uVar11] = pbVar5->array[uVar11] | 1L << ((byte)uVar13 & 0x3f);
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 100);
  uVar13 = 0x3e6;
  do {
    uVar13 = uVar13 + 2;
    uVar11 = uVar13 >> 6;
    if ((uVar11 < pbVar5->arraysize) || (_Var4 = bitset_grow(pbVar5,uVar11 + 1), _Var4)) {
      pbVar5->array[uVar11] = pbVar5->array[uVar11] | 1L << ((byte)uVar13 & 0x3e);
    }
  } while (uVar13 < 0x44a);
  uVar13 = 0;
  uVar11 = 0;
  do {
    uVar7 = uVar13 >> 6;
    if (uVar7 < pbVar5->arraysize) {
      uVar6 = pbVar5->array[uVar7] >> ((byte)uVar13 & 0x3f);
      if (uVar6 == 0) {
        lVar8 = uVar7 * -0x40;
        do {
          uVar7 = uVar7 + 1;
          if (pbVar5->arraysize == uVar7) goto LAB_001027e0;
          uVar6 = pbVar5->array[uVar7];
          lVar8 = lVar8 + -0x40;
        } while (uVar6 == 0);
        lVar2 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        uVar13 = lVar2 - lVar8;
      }
      else {
        lVar8 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
          }
        }
        uVar13 = uVar13 + lVar8;
      }
      bVar3 = true;
    }
    else {
LAB_001027e0:
      bVar3 = false;
    }
    if (!bVar3) {
      if (uVar11 == 0x96) {
        bitset_free(pbVar5);
        return;
      }
      goto LAB_00102822;
    }
    uVar7 = uVar11 * 2 + 800;
    if (uVar11 < 100) {
      uVar7 = uVar11;
    }
    if (uVar13 != uVar7) {
      test_next_bit_iterate_cold_2();
LAB_00102822:
      test_next_bit_iterate_cold_1();
      test_next_bit_iterate();
      test_next_bits_iterate();
      test_set_to_val();
      test_construct();
      test_union_intersection();
      test_iterate();
      test_iterate2();
      test_max_min();
      test_counts();
      test_shift_right();
      test_shift_left();
      test_disjoint();
      test_intersects();
      test_contains_all();
      test_contains_all_different_sizes();
      puts("All TEST_ASSERTs passed. Code is probably ok.");
      return;
    }
    uVar11 = uVar11 + 1;
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

void test_contains_all() {
  bitset_t *superset = bitset_create();
  bitset_t *subset = bitset_create();

  for (int i = 0; i < 1000; i++) {
    bitset_set(superset, i);
    if (i % 2 == 0)
      bitset_set(subset, i);
  }

  TEST_ASSERT(bitset_contains_all(superset, subset));
  TEST_ASSERT(!bitset_contains_all(subset, superset));

  bitset_set(subset, 1001);

  TEST_ASSERT(!bitset_contains_all(superset, subset));
  TEST_ASSERT(!bitset_contains_all(subset, superset));

  bitset_free(superset);
  bitset_free(subset);
}